

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(AesGcmCtrV1 *a,AesGcmCtrV1 *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  std::swap<char,std::char_traits<char>,std::allocator<char>>(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<bool>((bool *)(in_RDI + 0x48),(bool *)(in_RSI + 0x48));
  std::swap<duckdb_parquet::_AesGcmCtrV1__isset>
            ((_AesGcmCtrV1__isset *)(in_RDI + 0x49),(_AesGcmCtrV1__isset *)(in_RSI + 0x49));
  return;
}

Assistant:

void swap(AesGcmCtrV1 &a, AesGcmCtrV1 &b) {
  using ::std::swap;
  swap(a.aad_prefix, b.aad_prefix);
  swap(a.aad_file_unique, b.aad_file_unique);
  swap(a.supply_aad_prefix, b.supply_aad_prefix);
  swap(a.__isset, b.__isset);
}